

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

char16 __thiscall UnifiedRegex::CharSet<char16_t>::Singleton(CharSet<char16_t> *this)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  undefined4 *puVar4;
  uint u;
  
  if ((this->rep).compact.countPlusOne != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x23b,"(IsSingleton())","IsSingleton()");
    if (!bVar2) goto LAB_00cdbb53;
    *puVar4 = 0;
  }
  u = (this->rep).compact.cs[0];
  if (0xffff < u) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x23c,"(rep.compact.cs[0] <= MaxUChar)","rep.compact.cs[0] <= MaxUChar");
    if (!bVar2) {
LAB_00cdbb53:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    u = (this->rep).compact.cs[0];
  }
  CVar3 = Chars<char16_t>::UTC(u);
  return CVar3;
}

Assistant:

inline char16 Singleton() const
        {
            Assert(IsSingleton());
            Assert(rep.compact.cs[0] <= MaxUChar);
            return UTC(rep.compact.cs[0]);
        }